

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  int iVar1;
  
  iVar1 = 0;
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op == '\x1a') {
      pExpr->op = '^';
    }
    else {
      iVar1 = sqlite3ResolveExprNames(pName,pExpr);
      if (iVar1 == 0) {
        iVar1 = sqlite3ExprIsConstant(pExpr);
        if (iVar1 != 0) {
          return 0;
        }
        sqlite3ErrorMsg(pName->pParse,"invalid name: \"%s\"",(pExpr->u).zToken);
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
      if( rc==SQLITE_OK && !sqlite3ExprIsConstant(pExpr) ){
        sqlite3ErrorMsg(pName->pParse, "invalid name: \"%s\"", pExpr->u.zToken);
        return SQLITE_ERROR;
      }
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}